

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O0

void __thiscall sznet::MutexLock::UnassignGuard::UnassignGuard(UnassignGuard *this,MutexLock *owner)

{
  MutexLock *owner_local;
  UnassignGuard *this_local;
  
  this->m_owner = owner;
  unassignHolder(this->m_owner);
  return;
}

Assistant:

explicit UnassignGuard(MutexLock& owner): 
			m_owner(owner)
		{
			// 在执行等待之前，使用UnassignGuard的构造函数将mutex的holder清空
			// (因为当前线程会休眠，暂时失去对mutex的所有权)。
			// 接着调用pthread_cond_wait等待其他线程的通知。
			// 当其他某个线程调用了notify/notifyAll时，当前线程被唤醒，接着在wait返回时，
			// UnassignGuard的析构函数自动将mutex的holder设置为当前线程。
			m_owner.unassignHolder();
		}